

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O0

void rw::syncLTMRecurse(Frame *frame,uint8 hierarchyFlags)

{
  Frame *pFVar1;
  byte local_11;
  Frame *pFStack_10;
  uint8 hierarchyFlags_local;
  Frame *frame_local;
  
  local_11 = hierarchyFlags;
  for (pFStack_10 = frame; pFStack_10 != (Frame *)0x0; pFStack_10 = pFStack_10->next) {
    local_11 = local_11 | (pFStack_10->object).privateFlags;
    if ((local_11 & 4) != 0) {
      pFVar1 = Frame::getParent(pFStack_10);
      Matrix::mult(&pFStack_10->ltm,&pFStack_10->matrix,&pFVar1->ltm);
      (pFStack_10->object).privateFlags = (pFStack_10->object).privateFlags & 0xfb;
    }
    syncLTMRecurse(pFStack_10->child,local_11);
  }
  return;
}

Assistant:

static void
syncLTMRecurse(Frame *frame, uint8 hierarchyFlags)
{
	for(; frame; frame = frame->next){
		// If frame is dirty or any parent was dirty, update LTM
		hierarchyFlags |= frame->object.privateFlags;
		if(hierarchyFlags & Frame::SUBTREESYNCLTM){
			Matrix::mult(&frame->ltm, &frame->matrix,
			             &frame->getParent()->ltm);
			frame->object.privateFlags &= ~Frame::SUBTREESYNCLTM;
		}
		// And synch all children
		syncLTMRecurse(frame->child, hierarchyFlags);
	}
}